

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marketgenerator.cpp
# Opt level: O2

void __thiscall hedg::MarketGenerator::poll_within(MarketGenerator *this,int time1,int time2)

{
  double dVar1;
  string time_now;
  duration<long,_std::ratio<1L,_1L>_> local_80;
  string local_78;
  string local_58;
  string local_38 [32];
  
  wait_for_gen(this);
  Timing::now_abi_cxx11_();
  std::__cxx11::string::string
            ((string *)&local_58,
             (string *)
             &((this->markets_).c.
               super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur)->second);
  std::__cxx11::string::string((string *)&local_78,local_38);
  dVar1 = Timing::time_diff_mins(&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  if ((dVar1 < (double)time1) || ((double)time2 < dVar1)) {
    if (dVar1 < (double)time1) {
      std::
      deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
      ::pop_front(&(this->markets_).c);
    }
    local_80.__r = 10;
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_80);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void MarketGenerator::poll_within(int time1, int time2) {

	wait_for_gen();
	std::string time_now = Timing::now();
	double diff = Timing::time_diff_mins(markets_.front().second.market_start_time_, time_now);
	if (diff >= time1 && diff <= time2)
		return;
	if (diff < time1) {
		markets_.pop();
	}
	std::this_thread::sleep_for(std::chrono::duration(std::chrono::seconds(10)));
}